

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsortxx.h
# Opt level: O0

int divsufsortxx::substring::compare<char*,bitmap::BitmapArray<long>::iterator>
              (char *T,iterator p1,iterator p2,value_type depth)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  char *pcVar4;
  long in_RDI;
  long in_R9;
  bool bVar5;
  char *U2n;
  char *U1n;
  char *U2;
  char *U1;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  char *local_50;
  char *local_38;
  
  bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11ae89);
  lVar2 = bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x11aea6);
  local_38 = (char *)(in_RDI + in_R9 + lVar2);
  bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11aedb);
  lVar2 = bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x11aef8);
  local_50 = (char *)(in_RDI + in_R9 + lVar2);
  bitmap::BitmapArray<long>::iterator::operator+
            ((iterator *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
             CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11af3e);
  lVar2 = bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x11af52);
  pcVar3 = (char *)(in_RDI + lVar2 + 2);
  bitmap::BitmapArray<long>::iterator::operator+
            ((iterator *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
             CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11af9c);
  lVar2 = bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x11afb0);
  pcVar4 = (char *)(in_RDI + lVar2 + 2);
  while( true ) {
    bVar5 = false;
    if ((local_38 < pcVar3) && (bVar5 = false, local_50 < pcVar4)) {
      bVar5 = *local_38 == *local_50;
    }
    if (!bVar5) break;
    local_38 = local_38 + 1;
    local_50 = local_50 + 1;
  }
  if (local_38 < pcVar3) {
    if (local_50 < pcVar4) {
      iVar1 = (uint)(*local_50 < *local_38) * 2 + -1;
    }
    else {
      iVar1 = 1;
    }
  }
  else {
    iVar1 = 0;
    if (local_50 < pcVar4) {
      iVar1 = -1;
    }
  }
  return iVar1;
}

Assistant:

int compare(StringIterator_type T, const SAIterator_type p1,
            const SAIterator_type p2,
            typename std::iterator_traits<SAIterator_type>::value_type depth) {
  StringIterator_type U1 = T + depth + *p1, U2 = T + depth + *p2, U1n = T
      + *(p1 + 1) + 2, U2n = T + *(p2 + 1) + 2;
  for (; (U1 < U1n) && (U2 < U2n) && (*U1 == *U2); ++U1, ++U2) {
  }

  return U1 < U1n ? (U2 < U2n ? (*U2 < *U1) * 2 - 1 : 1) :
//        (U2 < U2n ? *U1 - *U2 : 1) :
      (U2 < U2n ? -1 : 0);
}